

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

string * __thiscall
bloaty::(anonymous_namespace)::DoubleStringPrintf_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *fmt,double d)

{
  size_t sVar1;
  string *extraout_RAX;
  char buf [1024];
  char acStack_418 [1032];
  
  snprintf(acStack_418,0x400,(char *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_418,acStack_418 + sVar1);
  return extraout_RAX;
}

Assistant:

std::string DoubleStringPrintf(const char* fmt, double d) {
  char buf[1024];
  snprintf(buf, sizeof(buf), fmt, d);
  return std::string(buf);
}